

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O2

void mat_postmult_diag(csc *A,c_float *d)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = 0;
  lVar2 = A->n;
  if (A->n < 1) {
    lVar2 = lVar3;
  }
  while (lVar4 = lVar3, lVar4 != lVar2) {
    lVar1 = A->p[lVar4 + 1];
    for (lVar5 = A->p[lVar4]; lVar3 = lVar4 + 1, lVar5 < lVar1; lVar5 = lVar5 + 1) {
      A->x[lVar5] = d[lVar4] * A->x[lVar5];
    }
  }
  return;
}

Assistant:

void mat_postmult_diag(csc *A, const c_float *d) {
  c_int j, i;

  for (j = 0; j < A->n; j++) {                // Cycle over columns j
    for (i = A->p[j]; i < A->p[j + 1]; i++) { // Cycle every row i in column j
      A->x[i] *= d[j];                        // Scale by corresponding element
                                              // of d for column j
    }
  }
}